

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O1

int png_image_finish_read
              (png_imagep image,png_const_colorp background,void *buffer,png_int_32 row_stride,
              void *colormap)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  char *error_message;
  uint uVar4;
  png_image_read_control display;
  png_imagep local_68;
  void *pvStack_60;
  ulong local_58;
  void *pvStack_50;
  png_const_colorp local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (image == (png_imagep)0x0) {
    return 0;
  }
  if (image->version == 1) {
    uVar3 = image->format;
    uVar4 = 1;
    if ((uVar3 & 8) == 0) {
      uVar4 = (uVar3 & 3) + 1;
    }
    if ((uint)(0x7fffffff / (ulong)uVar4) < image->width) {
      error_message = "png_image_finish_read: row_stride too large";
    }
    else {
      uVar4 = uVar4 * image->width;
      if (row_stride == 0) {
        row_stride = uVar4;
      }
      uVar1 = -row_stride;
      if (0 < row_stride) {
        uVar1 = row_stride;
      }
      if (((buffer == (void *)0x0) || (image->opaque == (png_controlp)0x0)) || (uVar1 < uVar4)) {
        error_message = "png_image_finish_read: invalid argument";
      }
      else {
        uVar4 = 1;
        if ((uVar3 & 8) == 0) {
          uVar4 = ((uVar3 >> 2 & 1) != 0) + 1;
        }
        if ((uint)((0xffffffff / (ulong)uVar4) / (ulong)uVar1) < image->height) {
          error_message = "png_image_finish_read: image too large";
        }
        else {
          if (((uVar3 & 8) == 0) || ((colormap != (void *)0x0 && (image->colormap_entries != 0)))) {
            local_28 = 0;
            uStack_20 = 0;
            local_38 = 0;
            uStack_30 = 0;
            local_58 = (ulong)(uint)row_stride;
            uStack_40 = 0;
            local_68 = image;
            pvStack_60 = buffer;
            pvStack_50 = colormap;
            local_48 = background;
            if ((uVar3 & 8) == 0) {
              uVar3 = png_safe_execute(image,png_image_read_direct,&local_68);
            }
            else {
              iVar2 = png_safe_execute(image,png_image_read_colormap,&local_68);
              if (iVar2 == 0) {
                uVar3 = 0;
              }
              else {
                iVar2 = png_safe_execute(image,png_image_read_colormapped,&local_68);
                uVar3 = (uint)(iVar2 != 0);
              }
            }
            png_image_free(image);
            return uVar3;
          }
          error_message = "png_image_finish_read[color-map]: no color-map";
        }
      }
    }
  }
  else {
    error_message = "png_image_finish_read: damaged PNG_IMAGE_VERSION";
  }
  iVar2 = png_image_error(image,error_message);
  return iVar2;
}

Assistant:

int PNGAPI
png_image_finish_read(png_imagep image, png_const_colorp background,
    void *buffer, png_int_32 row_stride, void *colormap)
{
   if (image != NULL && image->version == PNG_IMAGE_VERSION)
   {
      /* Check for row_stride overflow.  This check is not performed on the
       * original PNG format because it may not occur in the output PNG format
       * and libpng deals with the issues of reading the original.
       */
      const unsigned int channels = PNG_IMAGE_PIXEL_CHANNELS(image->format);

      /* The following checks just the 'row_stride' calculation to ensure it
       * fits in a signed 32-bit value.  Because channels/components can be
       * either 1 or 2 bytes in size the length of a row can still overflow 32
       * bits; this is just to verify that the 'row_stride' argument can be
       * represented.
       */
      if (image->width <= 0x7fffffffU/channels) /* no overflow */
      {
         png_uint_32 check;
         const png_uint_32 png_row_stride = image->width * channels;

         if (row_stride == 0)
            row_stride = (png_int_32)/*SAFE*/png_row_stride;

         if (row_stride < 0)
            check = (png_uint_32)(-row_stride);

         else
            check = (png_uint_32)row_stride;

         /* This verifies 'check', the absolute value of the actual stride
          * passed in and detects overflow in the application calculation (i.e.
          * if the app did actually pass in a non-zero 'row_stride'.
          */
         if (image->opaque != NULL && buffer != NULL && check >= png_row_stride)
         {
            /* Now check for overflow of the image buffer calculation; this
             * limits the whole image size to 32 bits for API compatibility with
             * the current, 32-bit, PNG_IMAGE_BUFFER_SIZE macro.
             *
             * The PNG_IMAGE_BUFFER_SIZE macro is:
             *
             *    (PNG_IMAGE_PIXEL_COMPONENT_SIZE(fmt)*height*(row_stride))
             *
             * And the component size is always 1 or 2, so make sure that the
             * number of *bytes* that the application is saying are available
             * does actually fit into a 32-bit number.
             *
             * NOTE: this will be changed in 1.7 because PNG_IMAGE_BUFFER_SIZE
             * will be changed to use png_alloc_size_t; bigger images can be
             * accomodated on 64-bit systems.
             */
            if (image->height <=
                0xffffffffU/PNG_IMAGE_PIXEL_COMPONENT_SIZE(image->format)/check)
            {
               if ((image->format & PNG_FORMAT_FLAG_COLORMAP) == 0 ||
                  (image->colormap_entries > 0 && colormap != NULL))
               {
                  int result;
                  png_image_read_control display;

                  memset(&display, 0, (sizeof display));
                  display.image = image;
                  display.buffer = buffer;
                  display.row_stride = row_stride;
                  display.colormap = colormap;
                  display.background = background;
                  display.local_row = NULL;

                  /* Choose the correct 'end' routine; for the color-map case
                   * all the setup has already been done.
                   */
                  if ((image->format & PNG_FORMAT_FLAG_COLORMAP) != 0)
                     result =
                         png_safe_execute(image,
                             png_image_read_colormap, &display) &&
                             png_safe_execute(image,
                             png_image_read_colormapped, &display);

                  else
                     result =
                        png_safe_execute(image,
                            png_image_read_direct, &display);

                  png_image_free(image);
                  return result;
               }

               else
                  return png_image_error(image,
                      "png_image_finish_read[color-map]: no color-map");
            }

            else
               return png_image_error(image,
                   "png_image_finish_read: image too large");
         }

         else
            return png_image_error(image,
                "png_image_finish_read: invalid argument");
      }

      else
         return png_image_error(image,
             "png_image_finish_read: row_stride too large");
   }

   else if (image != NULL)
      return png_image_error(image,
          "png_image_finish_read: damaged PNG_IMAGE_VERSION");

   return 0;
}